

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::emit_interface_block(CompilerGLSL *this,SPIRVariable *var)

{
  ID *__k;
  uint *puVar1;
  size_t sVar2;
  bool *pbVar3;
  TypedID<(spirv_cross::Types)1> *pTVar4;
  uint64_t uVar5;
  CompilerGLSL *this_00;
  bool bVar6;
  int iVar7;
  SPIRType *type;
  mapped_type *pmVar8;
  undefined4 extraout_var;
  SPIRFunction *pSVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  SPIREntryPoint *pSVar11;
  iterator iVar12;
  SPIRType *pSVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  TypedID<(spirv_cross::Types)0> *in_R9;
  bool bVar17;
  __hashtable *__h;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *this_01;
  char *__end;
  SPIRVariable *pSVar18;
  long lVar19;
  __node_gen_type __node_gen;
  string block_name;
  char *qual;
  undefined1 local_100 [32];
  SPIRVariable *local_e0;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  CompilerGLSL *local_b0;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_80;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  char *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                    *(uint *)&(var->super_IVariant).field_0xc);
  local_a8 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)&(this->super_Compiler).ir.meta;
  __k = &(type->super_IVariant).self;
  pmVar8 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[](local_a8,__k);
  uVar5 = (pmVar8->decoration).decoration_flags.lower;
  iVar7 = (*(this->super_Compiler)._vptr_Compiler[0x2c])(this,var);
  local_58 = (char *)CONCAT44(extraout_var,iVar7);
  local_e0 = var;
  if ((uVar5 & 4) != 0) {
    if ((this->options).force_flattened_io_blocks == false) {
      bVar6 = (this->options).es;
      uVar14 = (this->options).version;
      uVar16 = 0x95;
      if (bVar6 != false) {
        uVar16 = 0x135;
      }
      if (uVar16 < uVar14) {
        local_b0 = this;
        if (uVar14 < 0x140 && bVar6 == true) {
          local_d8._M_unused._M_object = &local_c8;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d8,"GL_EXT_geometry_shader","");
          pbVar10 = (this->forced_extensions).
                    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .ptr;
          pbVar10 = ::std::
                    __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                              (pbVar10,pbVar10 + (this->forced_extensions).
                                                 super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                 .buffer_size,&local_d8);
          if (pbVar10 ==
              (this->forced_extensions).
              super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .ptr + (this->forced_extensions).
                     super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .buffer_size) {
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a0,"GL_EXT_tessellation_shader","");
            this = local_b0;
            pbVar10 = (local_b0->forced_extensions).
                      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      .ptr;
            pbVar10 = ::std::
                      __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                (pbVar10,pbVar10 + (local_b0->forced_extensions).
                                                                                                      
                                                  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  .buffer_size,&local_a0);
            bVar6 = pbVar10 ==
                    (this->forced_extensions).
                    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .ptr + (this->forced_extensions).
                           super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .buffer_size;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p);
            }
          }
          else {
            bVar6 = false;
          }
          if ((code **)local_d8._M_unused._0_8_ != &local_c8) {
            operator_delete(local_d8._M_unused._M_object);
          }
          if (bVar6) {
            local_d8._M_unused._M_object = &local_c8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d8,"GL_EXT_shader_io_blocks","");
            require_extension_internal(this,(string *)&local_d8);
            if ((code **)local_d8._M_unused._0_8_ != &local_c8) {
              operator_delete(local_d8._M_unused._M_object);
            }
          }
        }
        (*(this->super_Compiler)._vptr_Compiler[6])
                  (&local_d8,this,(ulong)(type->super_IVariant).self.id,0);
        pSVar18 = local_e0;
        this_01 = &(this->block_output_names)._M_h;
        if (type->storage == StorageClassInput) {
          this_01 = &(this->block_input_names)._M_h;
        }
        if ((local_d8._8_8_ == 0) ||
           (iVar12 = ::std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::find(this_01,(key_type *)&local_d8),
           iVar12.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur != (__node_type *)0x0)) {
          (*(this->super_Compiler)._vptr_Compiler[3])(local_100,this,(ulong)__k->id);
          ::std::__cxx11::string::_M_assign((string *)local_d8._M_pod_data);
          if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)local_100._0_8_ !=
              (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)(local_100 + 0x10)) {
            operator_delete((void *)local_100._0_8_);
          }
        }
        else {
          local_100._0_8_ = this_01;
          ::std::
          _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                    ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)this_01,&local_d8);
        }
        if (local_d8._8_8_ == 0) {
          pSVar13 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                               ptr + *(uint *)&(pSVar18->super_IVariant).field_0xc);
          join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&,char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&>
                    ((string *)local_100,(spirv_cross *)0x2e7de5,
                     (char (*) [2])&(pSVar13->super_IVariant).self,
                     (TypedID<(spirv_cross::Types)0> *)0x2e7de5,
                     (char (*) [2])&(pSVar18->super_IVariant).self,in_R9);
          ::std::__cxx11::string::operator=((string *)local_d8._M_pod_data,(string *)local_100);
          pSVar18 = local_e0;
          if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)local_100._0_8_ !=
              (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)(local_100 + 0x10)) {
            operator_delete((void *)local_100._0_8_);
            pSVar18 = local_e0;
          }
        }
        local_100._0_8_ = &this->resource_names;
        local_80 = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_100._0_8_;
        ::std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)local_100._0_8_,&local_d8);
        layout_for_variable_abi_cxx11_((string *)local_100,this,pSVar18);
        statement<std::__cxx11::string,char_const*&,std::__cxx11::string&>
                  (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_100,&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8);
        if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
          operator_delete((void *)local_100._0_8_);
        }
        statement<char_const(&)[2]>(this,(char (*) [2])"{");
        this->indent = this->indent + 1;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::clear(&(type->member_name_cache)._M_h);
        sVar2 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                buffer_size;
        if (sVar2 != 0) {
          pTVar4 = (type->member_types).
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr;
          lVar19 = sVar2 << 2;
          uVar15 = 0;
          do {
            add_member_name(local_b0,type,(uint32_t)uVar15);
            uVar14 = pTVar4[uVar15].id;
            local_100._0_8_ = local_100 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"","");
            (*(local_b0->super_Compiler)._vptr_Compiler[0x15])
                      (local_b0,type,(ulong)uVar14,uVar15 & 0xffffffff,(string *)local_100,0);
            pSVar18 = local_e0;
            if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
              operator_delete((void *)local_100._0_8_);
            }
            uVar15 = uVar15 + 1;
            lVar19 = lVar19 + -4;
          } while (lVar19 != 0);
        }
        local_100._0_4_ = (pSVar18->super_IVariant).self.id;
        pmVar8 = ::std::__detail::
                 _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[](local_a8,(key_type *)local_100);
        this_00 = local_b0;
        add_variable(local_b0,local_80,&local_b0->block_names,(string *)pmVar8);
        pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
        (*(this_00->super_Compiler)._vptr_Compiler[6])
                  (local_78,this_00,(ulong)(pSVar18->super_IVariant).self.id);
        (*(this_00->super_Compiler)._vptr_Compiler[0x23])(&local_50,this_00,type);
        join<std::__cxx11::string,std::__cxx11::string>
                  ((string *)local_100,(spirv_cross *)local_78,&local_50,pbVar10);
        end_scope_decl(this_00,(string *)local_100);
        if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
          operator_delete((void *)local_100._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if (local_78[0] != local_68) {
          operator_delete(local_78[0]);
        }
        statement<char_const(&)[1]>(this_00,(char (*) [1])0x2dc0a8);
        if ((code **)local_d8._M_unused._0_8_ == &local_c8) {
          return;
        }
        operator_delete(local_d8._M_unused._M_object);
        return;
      }
    }
    goto LAB_001b5123;
  }
  if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
    if ((this->options).force_flattened_io_blocks != false) {
LAB_001b5123:
      emit_flattened_io_block(this,var,local_58);
      return;
    }
    uVar14 = 0x95;
    if ((this->options).es != false) {
      uVar14 = 0x135;
    }
    if ((this->options).version <= uVar14) goto LAB_001b5123;
  }
  local_d8._0_4_ = (var->super_IVariant).self.id;
  pmVar8 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[](local_a8,(key_type *)&local_d8);
  add_variable(this,&this->resource_names,&this->block_names,(string *)pmVar8);
  uVar14 = 0;
  if (type->storage == StorageClassInput) {
    bVar6 = false;
    if ((type->array).super_VectorView<unsigned_int>.buffer_size == 0) goto LAB_001b4ecc;
    bVar6 = Compiler::has_decoration
                      (&this->super_Compiler,(ID)(local_e0->super_IVariant).self.id,DecorationPatch)
    ;
    if (!bVar6) {
      pSVar11 = Compiler::get_entry_point(&this->super_Compiler);
      bVar6 = true;
      if (pSVar11->model != ExecutionModelTessellationControl) {
        pSVar11 = Compiler::get_entry_point(&this->super_Compiler);
        bVar6 = pSVar11->model == ExecutionModelTessellationEvaluation;
      }
      goto LAB_001b4ecc;
    }
  }
  bVar6 = false;
LAB_001b4ecc:
  pSVar18 = local_e0;
  bVar17 = true;
  if (bVar6) {
    puVar1 = (type->array).super_VectorView<unsigned_int>.ptr;
    sVar2 = (type->array).super_VectorView<unsigned_int>.buffer_size;
    uVar14 = puVar1[sVar2 - 1];
    puVar1[sVar2 - 1] = 0;
    pbVar3 = (type->array_size_literal).super_VectorView<bool>.ptr;
    sVar2 = (type->array_size_literal).super_VectorView<bool>.buffer_size;
    bVar17 = pbVar3[sVar2 - 1];
    pbVar3[sVar2 - 1] = true;
  }
  layout_for_variable_abi_cxx11_((string *)&local_d8,this,local_e0);
  (*(this->super_Compiler)._vptr_Compiler[0x2b])
            (&local_a0,this,(ulong)(pSVar18->super_IVariant).self.id);
  (*(this->super_Compiler)._vptr_Compiler[6])
            (local_78,this,(ulong)(pSVar18->super_IVariant).self.id,1);
  (*(this->super_Compiler)._vptr_Compiler[0x1a])
            (local_100,this,type,local_78,(ulong)(pSVar18->super_IVariant).self.id);
  statement<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
            (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
             &local_a0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
             (char (*) [2])0x2ddbde);
  if ((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
       *)local_100._0_8_ !=
      (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
       *)(local_100 + 0x10)) {
    operator_delete((void *)local_100._0_8_);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((code **)local_d8._M_unused._0_8_ != &local_c8) {
    operator_delete(local_d8._M_unused._M_object);
  }
  pSVar18 = local_e0;
  if (bVar6) {
    (type->array).super_VectorView<unsigned_int>.ptr
    [(type->array).super_VectorView<unsigned_int>.buffer_size - 1] = uVar14;
    (type->array_size_literal).super_VectorView<bool>.ptr
    [(type->array_size_literal).super_VectorView<bool>.buffer_size - 1] = bVar17;
  }
  if ((local_e0->storage == StorageClassOutput) && ((local_e0->initializer).id != 0)) {
    pSVar9 = Variant::get<spirv_cross::SPIRFunction>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        (this->super_Compiler).ir.default_entry_point.id);
    local_d8._8_8_ = pSVar18;
    pcStack_c0 = ::std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_glsl.cpp:2417:9)>
                 ::_M_invoke;
    local_c8 = ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_glsl.cpp:2417:9)>
               ::_M_manager;
    local_d8._M_unused._M_object = this;
    SmallVector<std::function<void_()>,_0UL>::push_back
              (&pSVar9->fixup_hooks_in,(function<void_()> *)&local_d8);
    if (local_c8 != (code *)0x0) {
      (*local_c8)(&local_d8,&local_d8,3);
    }
  }
  return;
}

Assistant:

void CompilerGLSL::emit_interface_block(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);

	// Either make it plain in/out or in/out blocks depending on what shader is doing ...
	bool block = ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock);
	const char *qual = to_storage_qualifiers_glsl(var);

	if (block)
	{
		// ESSL earlier than 310 and GLSL earlier than 150 did not support
		// I/O variables which are struct types.
		// To support this, flatten the struct into separate varyings instead.
		if (options.force_flattened_io_blocks || (options.es && options.version < 310) ||
		    (!options.es && options.version < 150))
		{
			// I/O blocks on ES require version 310 with Android Extension Pack extensions, or core version 320.
			// On desktop, I/O blocks were introduced with geometry shaders in GL 3.2 (GLSL 150).
			emit_flattened_io_block(var, qual);
		}
		else
		{
			if (options.es && options.version < 320)
			{
				// Geometry and tessellation extensions imply this extension.
				if (!has_extension("GL_EXT_geometry_shader") && !has_extension("GL_EXT_tessellation_shader"))
					require_extension_internal("GL_EXT_shader_io_blocks");
			}

			// Block names should never alias.
			auto block_name = to_name(type.self, false);

			// The namespace for I/O blocks is separate from other variables in GLSL.
			auto &block_namespace = type.storage == StorageClassInput ? block_input_names : block_output_names;

			// Shaders never use the block by interface name, so we don't
			// have to track this other than updating name caches.
			if (block_name.empty() || block_namespace.find(block_name) != end(block_namespace))
				block_name = get_fallback_name(type.self);
			else
				block_namespace.insert(block_name);

			// If for some reason buffer_name is an illegal name, make a final fallback to a workaround name.
			// This cannot conflict with anything else, so we're safe now.
			if (block_name.empty())
				block_name = join("_", get<SPIRType>(var.basetype).self, "_", var.self);

			// Instance names cannot alias block names.
			resource_names.insert(block_name);

			statement(layout_for_variable(var), qual, block_name);
			begin_scope();

			type.member_name_cache.clear();

			uint32_t i = 0;
			for (auto &member : type.member_types)
			{
				add_member_name(type, i);
				emit_struct_member(type, member, i);
				i++;
			}

			add_resource_name(var.self);
			end_scope_decl(join(to_name(var.self), type_to_array_glsl(type)));
			statement("");
		}
	}
	else
	{
		// ESSL earlier than 310 and GLSL earlier than 150 did not support
		// I/O variables which are struct types.
		// To support this, flatten the struct into separate varyings instead.
		if (type.basetype == SPIRType::Struct &&
		    (options.force_flattened_io_blocks || (options.es && options.version < 310) ||
		     (!options.es && options.version < 150)))
		{
			emit_flattened_io_block(var, qual);
		}
		else
		{
			add_resource_name(var.self);

			// Tessellation control and evaluation shaders must have either gl_MaxPatchVertices or unsized arrays for input arrays.
			// Opt for unsized as it's the more "correct" variant to use.
			bool control_point_input_array = type.storage == StorageClassInput && !type.array.empty() &&
			                                 !has_decoration(var.self, DecorationPatch) &&
			                                 (get_entry_point().model == ExecutionModelTessellationControl ||
			                                  get_entry_point().model == ExecutionModelTessellationEvaluation);

			uint32_t old_array_size = 0;
			bool old_array_size_literal = true;

			if (control_point_input_array)
			{
				swap(type.array.back(), old_array_size);
				swap(type.array_size_literal.back(), old_array_size_literal);
			}

			statement(layout_for_variable(var), to_qualifiers_glsl(var.self),
			          variable_decl(type, to_name(var.self), var.self), ";");

			if (control_point_input_array)
			{
				swap(type.array.back(), old_array_size);
				swap(type.array_size_literal.back(), old_array_size_literal);
			}

			// If a StorageClassOutput variable has an initializer, we need to initialize it in main().
			if (var.storage == StorageClassOutput && var.initializer)
			{
				auto &entry_func = this->get<SPIRFunction>(ir.default_entry_point);
				entry_func.fixup_hooks_in.push_back(
				    [&]() { statement(to_name(var.self), " = ", to_expression(var.initializer), ";"); });
			}
		}
	}
}